

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_multi_socket(Curl_multi *multi,curl_socket_t s,int ev_bitmask)

{
  CURLMcode CVar1;
  _Bool local_39;
  connectdata *pcStack_38;
  _Bool done;
  connectdata *conn;
  Curl_llist_node *e;
  Curl_easy *data;
  cpool *cpool;
  int ev_bitmask_local;
  curl_socket_t s_local;
  Curl_multi *multi_local;
  
  data = (Curl_easy *)&multi->cpool;
  e = (Curl_llist_node *)(multi->cpool).idata;
  cpool._0_4_ = ev_bitmask;
  cpool._4_4_ = s;
  _ev_bitmask_local = multi;
  if (data != (Curl_easy *)0x0) {
    if (((multi->cpool).share != (Curl_share *)0x0) &&
       ((((multi->cpool).share)->specifier & 0x20) != 0)) {
      Curl_share_lock((multi->cpool).idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    *(byte *)&(data->msg).extmsg.data = *(byte *)&(data->msg).extmsg.data & 0xfe | 1;
  }
  conn = (connectdata *)Curl_llist_head((Curl_llist *)&(data->conn_queue)._next);
  do {
    if (conn == (connectdata *)0x0) {
LAB_0012153a:
      if (((data != (Curl_easy *)0x0) &&
          (*(byte *)&(data->msg).extmsg.data = *(byte *)&(data->msg).extmsg.data & 0xfe,
          *(long *)&(data->msg).extmsg != 0)) &&
         ((*(uint *)(*(long *)&(data->msg).extmsg + 4) & 0x20) != 0)) {
        Curl_share_unlock((Curl_easy *)(data->msg).list._prev,CURL_LOCK_DATA_CONNECT);
      }
      return;
    }
    pcStack_38 = (connectdata *)Curl_node_elem(&conn->cpool_node);
    if ((cpool._4_4_ == pcStack_38->sock[0]) || (cpool._4_4_ == pcStack_38->sock[1])) {
      Curl_attach_connection((Curl_easy *)e,pcStack_38);
      cpool_run_conn_shutdown((Curl_easy *)e,pcStack_38,&local_39);
      Curl_detach_connection((Curl_easy *)e);
      if (((local_39 & 1U) != 0) ||
         (CVar1 = cpool_update_shutdown_ev(_ev_bitmask_local,(Curl_easy *)e,pcStack_38),
         CVar1 != CURLM_OK)) {
        Curl_node_remove(&conn->cpool_node);
        cpool_close_and_destroy((cpool *)data,pcStack_38,(Curl_easy *)0x0,false);
      }
      goto LAB_0012153a;
    }
    conn = (connectdata *)Curl_node_next(&conn->cpool_node);
  } while( true );
}

Assistant:

void Curl_cpool_multi_socket(struct Curl_multi *multi,
                             curl_socket_t s, int ev_bitmask)
{
  struct cpool *cpool = &multi->cpool;
  struct Curl_easy *data = cpool->idata;
  struct Curl_llist_node *e;
  struct connectdata *conn;
  bool done;

  (void)ev_bitmask;
  DEBUGASSERT(multi->socket_cb);
  CPOOL_LOCK(cpool);
  e = Curl_llist_head(&cpool->shutdowns);
  while(e) {
    conn = Curl_node_elem(e);
    if(s == conn->sock[FIRSTSOCKET] || s == conn->sock[SECONDARYSOCKET]) {
      Curl_attach_connection(data, conn);
      cpool_run_conn_shutdown(data, conn, &done);
      DEBUGF(infof(data, "[CCACHE] shutdown #%" FMT_OFF_T ", done=%d",
                   conn->connection_id, done));
      Curl_detach_connection(data);
      if(done || cpool_update_shutdown_ev(multi, data, conn)) {
        Curl_node_remove(e);
        cpool_close_and_destroy(cpool, conn, NULL, FALSE);
      }
      break;
    }
    e = Curl_node_next(e);
  }
  CPOOL_UNLOCK(cpool);
}